

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FreeIndex(sqlite3 *db,Index *p)

{
  Index *p_local;
  sqlite3 *db_local;
  
  sqlite3DeleteIndexSamples(db,p);
  sqlite3ExprDelete(db,p->pPartIdxWhere);
  sqlite3ExprListDelete(db,p->aColExpr);
  sqlite3DbFree(db,p->zColAff);
  if ((*(ushort *)&p->field_0x63 >> 4 & 1) != 0) {
    sqlite3DbFree(db,p->azColl);
  }
  sqlite3_free(p->aiRowEst);
  sqlite3DbFree(db,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FreeIndex(sqlite3 *db, Index *p){
#ifndef SQLITE_OMIT_ANALYZE
  sqlite3DeleteIndexSamples(db, p);
#endif
  sqlite3ExprDelete(db, p->pPartIdxWhere);
  sqlite3ExprListDelete(db, p->aColExpr);
  sqlite3DbFree(db, p->zColAff);
  if( p->isResized ) sqlite3DbFree(db, (void *)p->azColl);
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  sqlite3_free(p->aiRowEst);
#endif
  sqlite3DbFree(db, p);
}